

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  FieldDescriptor *pFVar1;
  EnforceOptimizeMode EVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  LogMessage *other;
  char *format_00;
  char *format_01;
  undefined1 local_90 [32];
  Hex local_70;
  LogMessage local_60;
  
  if (*(char *)(*(long *)(field + 0x78) + 0x4f) != '\0') {
    format_00 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _weak_field_map_.Has($number$);\n}\n"
    ;
    goto LAB_0028c0b2;
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60._0_8_ = FieldDescriptor::TypeOnceInit;
      local_90._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_60,
                 (FieldDescriptor **)local_90);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
      return;
    }
    if ((*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') && (*(int *)(field + 0x3c) != 3)) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_60._0_8_ = FieldDescriptor::TypeOnceInit;
        local_90._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_60,
                   (FieldDescriptor **)local_90);
      }
      if (*(int *)(field + 0x38) == 0xb) {
        EVar2 = (this->options_).enforce_mode;
        if (EVar2 == kSpeed) {
          if ((this->options_).opensource_runtime != true) goto LAB_0028be6b;
        }
        else if (((EVar2 != kLiteRuntime) &&
                 (*(int *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0xa4) != 3)) &&
                (((this->options_).opensource_runtime & 1U) == 0)) {
LAB_0028be6b:
          format_00 = 
          "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
          ;
          format_01 = 
          "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n"
          ;
          goto LAB_0028c0a7;
        }
      }
    }
    format_00 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
    ;
    format_01 = 
    "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
    ;
  }
  else {
    if (field[0x42] == (FieldDescriptor)0x0) {
      plVar6 = (long *)(*(long *)(field + 0x50) + 0x28);
    }
    else if (*(long *)(field + 0x60) == 0) {
      plVar6 = (long *)(*(long *)(field + 0x28) + 0x80);
    }
    else {
      plVar6 = (long *)(*(long *)(field + 0x60) + 0x50);
    }
    iVar3 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)((ulong)((long)field - *plVar6) >> 3) * 0x286bca1b];
    if (iVar3 < 0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x325);
      other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (has_bit_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)local_90,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    pFVar1 = (FieldDescriptor *)(local_90 + 0x10);
    local_90._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"has_array_index","");
    iVar5 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    local_70.value = CONCAT44(local_70.value._4_4_,iVar5 >> 5);
    Formatter::Set<int>(format,(string *)local_90,(int *)&local_70);
    if ((FieldDescriptor *)local_90._0_8_ != pFVar1) {
      operator_delete((void *)local_90._0_8_);
    }
    local_90._0_8_ = pFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"has_mask","");
    local_70.value = 1L << ((byte)iVar3 & 0x1f);
    local_70.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,(string *)local_90,&local_70);
    if ((FieldDescriptor *)local_90._0_8_ != pFVar1) {
      operator_delete((void *)local_90._0_8_);
    }
    Formatter::operator()<>
              (format,
               "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
              );
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_90._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70.value = (uint64)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_90,
                 (FieldDescriptor **)&local_70);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
      format_00 = 
      "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
      ;
      goto LAB_0028c0b2;
    }
    format_00 = 
    "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
    ;
    format_01 = "  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n";
    if ((*(char *)(*(long *)(field + 0x78) + 0x4d) == '\x01') && (*(int *)(field + 0x3c) != 3)) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_90._0_8_ = FieldDescriptor::TypeOnceInit;
        local_70.value = (uint64)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_90,
                   (FieldDescriptor **)&local_70);
      }
      if (*(int *)(field + 0x38) == 0xb) {
        EVar2 = (this->options_).enforce_mode;
        if (EVar2 == kSpeed) {
          bVar4 = (this->options_).opensource_runtime;
        }
        else {
          if ((EVar2 == kLiteRuntime) ||
             (format_00 = 
              "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
             , *(int *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0xa4) == 3)) goto LAB_0028c0a7;
          bVar4 = (this->options_).opensource_runtime & 1;
        }
        format_00 = 
        "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
        ;
        if (bVar4 == 0) goto LAB_0028c0b2;
      }
    }
  }
LAB_0028c0a7:
  Formatter::operator()<>(format,format_01);
LAB_0028c0b2:
  Formatter::operator()<>(format,format_00);
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // N.B.: without field presence, we do not use has-bits or generate
    // has_$name$() methods.
    int has_bit_index = has_bit_indices_[field->index()];
    GOOGLE_CHECK_GE(has_bit_index, 0);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else {
    // Message fields have a has_$name$() method.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsLazy(field, options_)) {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return !$name$_.IsCleared();\n"
            "}\n");
      } else {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return this != internal_default_instance() "
            "&& $name$_ != nullptr;\n"
            "}\n");
      }
      format(
          "inline bool $classname$::has_$name$() const {\n"
          "$annotate_accessor$"
          "  return _internal_has_$name$();\n"
          "}\n");
    }
  }
}